

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

sarimax_object sarimax_init(int p,int d,int q,int P,int D,int Q,int s,int r,int imean,int N)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  sarimax_object psVar5;
  bool bVar6;
  int iVar7;
  char *__s;
  long lVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint local_50;
  
  iVar10 = 0;
  if (D + P + Q != 0) {
    iVar10 = s;
  }
  if ((uint)imean < 2) {
    if ((-1 < (q | P | d | p | D | Q)) && (0 < N)) {
      bVar6 = (D + d == 0 || SCARRY4(D,d) != D + d < 0) && imean != 0;
      iVar7 = (uint)bVar6 + r;
      iVar2 = q + p + P;
      iVar3 = iVar2 + Q;
      iVar4 = iVar3 + iVar7;
      uVar11 = iVar10 * D + d;
      iVar9 = N - uVar11;
      iVar1 = iVar4 + iVar9;
      lVar8 = (long)iVar4;
      psVar5 = (sarimax_object)malloc((lVar8 * lVar8 + (long)iVar1) * 8 + 0xa8);
      psVar5->p = p;
      psVar5->d = d;
      psVar5->q = q;
      psVar5->N = N;
      psVar5->s = iVar10;
      psVar5->P = P;
      psVar5->D = D;
      psVar5->Q = Q;
      psVar5->Nused = iVar9;
      psVar5->M = iVar7;
      psVar5->r = r;
      psVar5->retval = 0;
      psVar5->start = 0;
      psVar5->imean = imean;
      iVar10 = iVar4 * iVar4;
      if (iVar1 + iVar10 != 0 && SCARRY4(iVar1,iVar10) == iVar1 + iVar10 < 0) {
        local_50 = (uint)bVar6;
        memset(psVar5 + 1,0,(ulong)(~uVar11 + Q + P + q + p + N + r + local_50 + iVar10) * 8 + 8);
      }
      psVar5->phi = (double *)(psVar5 + 1);
      psVar5->theta = (double *)(&psVar5[1].N + (ulong)(uint)p * 2);
      psVar5->PHI = (double *)(&psVar5[1].N + (long)(q + p) * 2);
      psVar5->THETA = (double *)(&psVar5[1].N + (long)iVar2 * 2);
      psVar5->exog = (double *)(&psVar5[1].N + (long)iVar3 * 2);
      psVar5->res = (double *)(&psVar5[1].N + lVar8 * 2);
      psVar5->vcov = (double *)(&psVar5[1].N + (long)iVar1 * 2);
      psVar5->method = 0;
      psVar5->optmethod = 5;
      psVar5->mean = 0.0;
      psVar5->var = 1.0;
      psVar5->lvcov = iVar10;
      psVar5->ncoeff = iVar4;
      return psVar5;
    }
    __s = "\n Input Values cannot be Negative. Program Exiting. ";
  }
  else {
    __s = "imean only accepts one of two values - 0 and 1 ";
  }
  puts(__s);
  exit(-1);
}

Assistant:

sarimax_object sarimax_init(int p, int d, int q,int P, int D, int Q,int s, int r,int imean, int N) {
	sarimax_object obj = NULL;
	int i,ncxreg;
	if (P + D + Q == 0) {
		s = 0;
	}

	if (imean < 0 || imean > 1) {
		printf("imean only accepts one of two values - 0 and 1 \n");
		exit(-1);
	}

	if (d + D > 0) {
		ncxreg = r;
	}
	else {
		if (imean == 0) {
			ncxreg = r;
		} else {
			ncxreg = 1 + r;
		}
	}
	if (p < 0 || d < 0 || q < 0 || N <= 0 || P < 0 || D < 0 || Q < 0) {
		printf("\n Input Values cannot be Negative. Program Exiting. \n");
		exit(-1);
	}
	/*
	Error Codes
	retval = 0 Input Error
	retval = 1 Probable Success
	retval = 4 Optimization Routine didn't converge
	retval = 7 Exogenous Variables are collinear
	retval = 10 Nonstationary AR part
	retavl = 12 Nonstationary Seasonal AR part
	retval = 15 Optimization Routine Encountered Inf/Nan Values

	*/
	
	obj = (sarimax_object)malloc(sizeof(struct sarimax_set) +
	 sizeof(double)* (p + q + P + Q + ncxreg + N - d - s*D) + sizeof(double)* (p + q + P + Q + ncxreg )*(p + q + P + Q + ncxreg ));

	obj->p = p;
	obj->d = d;
	obj->q = q;
	obj->N = N;
	obj->s = s;
	obj->P = P;
	obj->D = D;
	obj->Q = Q;
	obj->Nused = N - d - s*D;
	obj->M = ncxreg;
	obj->r = r;
	obj->retval = 0;
	obj->start = 0;
	obj->imean = imean;

	for (i = 0; i < (p + q + P + Q + ncxreg + N - d - s*D) + (p + q + P + Q + ncxreg )*(p + q + P + Q + ncxreg ); ++i) {
		obj->params[i] = 0.0;
	}
	obj->phi = &obj->params[0];
	obj->theta = &obj->params[p];
	obj->PHI = &obj->params[p + q];
	obj->THETA = &obj->params[p + q + P];
	obj->exog = &obj->params[p + q + P + Q];
	obj->res = &obj->params[p + q + P + Q + ncxreg];
	obj->vcov = &obj->params[p + q + P + Q + ncxreg + N - d - s*D];


	obj->method = 0;// 0 - MLE, 1 - CSS, 2 - Box-Jenkins
	obj->optmethod = 5; // Default Method is 5
	obj->mean = 0.0;
	obj->var = 1.0;
	obj->lvcov = (p + q + P + Q + ncxreg )*(p + q + P + Q + ncxreg );
	obj->ncoeff = p + q + P + Q + ncxreg ;

	return obj;
}